

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>::dx
          (value_type *__return_storage_ptr__,FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_> *this
          ,int i)

{
  double dVar1;
  int iVar2;
  Fad<Fad<double>_> *pFVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  Fad<double> *pFVar8;
  
  pFVar3 = this->right_;
  pFVar8 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pFVar8 = (pFVar3->dx_).ptr_to_data + i;
  }
  dVar1 = (this->left_).constant_;
  __return_storage_ptr__->val_ = pFVar8->val_ * dVar1;
  iVar2 = (pFVar8->dx_).num_elts;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if ((long)iVar2 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = iVar2;
    pdVar5 = (double *)operator_new__((long)iVar2 << 3);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar5;
    lVar6 = (long)(pFVar8->dx_).num_elts;
    __return_storage_ptr__->defaultVal = 0.0;
    if (0 < lVar6) {
      pdVar4 = (pFVar8->dx_).ptr_to_data;
      lVar7 = 0;
      do {
        pdVar5[lVar7] = pdVar4[lVar7] * dVar1;
        lVar7 = lVar7 + 1;
      } while (lVar6 != lVar7);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return  right_.dx(i) * left_.val();}